

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-pool.inc.c
# Opt level: O2

int tcg_out_pool_finalize(TCGContext_conflict9 *s)

{
  size_t __n;
  uint uVar1;
  tcg_insn_unit *__s;
  _Bool _Var2;
  int iVar3;
  TCGLabelPoolData *pTVar4;
  TCGLabelPoolData *pTVar5;
  tcg_insn_unit *__dest;
  
  pTVar4 = s->pool_labels;
  if (pTVar4 != (TCGLabelPoolData *)0x0) {
    __s = s->code_ptr;
    __dest = (tcg_insn_unit *)
             ((ulong)pTVar4->nlong * -8 & (ulong)(__s + (ulong)pTVar4->nlong * 8 + -1));
    memset(__s,0x90,(long)((int)__dest - (int)__s));
    s->data_gen_ptr = __dest;
    pTVar5 = (TCGLabelPoolData *)0x0;
    for (; pTVar4 != (TCGLabelPoolData *)0x0; pTVar4 = pTVar4->next) {
      uVar1 = pTVar4->nlong;
      __n = (ulong)uVar1 * 8;
      if (((pTVar5 == (TCGLabelPoolData *)0x0) || (pTVar5->nlong != uVar1)) ||
         (iVar3 = bcmp(pTVar5 + 1,pTVar4 + 1,__n), iVar3 != 0)) {
        if (s->code_gen_highwater < __dest) {
          return -1;
        }
        memcpy(__dest,pTVar4 + 1,__n);
        __dest = __dest + __n;
        pTVar5 = pTVar4;
      }
      _Var2 = patch_reloc(pTVar4->label,pTVar4->rtype,(intptr_t)(__dest + (ulong)uVar1 * -8),
                          pTVar4->addend);
      if (!_Var2) {
        return -2;
      }
    }
    s->code_ptr = __dest;
  }
  return 0;
}

Assistant:

static int tcg_out_pool_finalize(TCGContext *s)
{
    TCGLabelPoolData *p = s->pool_labels;
    TCGLabelPoolData *l = NULL;
    char *a;

    if (p == NULL) {
        return 0;
    }

    /* ??? Round up to qemu_icache_linesize, but then do not round
       again when allocating the next TranslationBlock structure.  */
    a = (void *)ROUND_UP((uintptr_t)s->code_ptr,
                         sizeof(tcg_target_ulong) * p->nlong);
    tcg_out_nop_fill(s->code_ptr, (tcg_insn_unit *)a - s->code_ptr);
    s->data_gen_ptr = a;

    for (; p != NULL; p = p->next) {
        size_t size = sizeof(tcg_target_ulong) * p->nlong;
        if (!l || l->nlong != p->nlong || memcmp(l->data, p->data, size)) {
            if (unlikely(a > (char *)s->code_gen_highwater)) {
                return -1;
            }
            memcpy(a, p->data, size);
            a += size;
            l = p;
        }
        if (!patch_reloc(p->label, p->rtype, (intptr_t)a - size, p->addend)) {
            return -2;
        }
    }

    s->code_ptr = (tcg_insn_unit *)a;
    return 0;
}